

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  char cVar1;
  char cVar2;
  char cVar3;
  undefined1 uVar4;
  size_t sVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  uint8_t *puVar12;
  byte *pbVar13;
  undefined1 *puVar14;
  size_t sVar15;
  uint local_7c;
  int codepoint;
  size_t bytes;
  size_t i;
  size_t pos;
  allocator local_49;
  string local_48 [8];
  string_t result;
  size_t space;
  bool ensure_ascii_local;
  string_t *s_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  throw_if_invalid_utf8(s);
  sVar5 = extra_space(s,ensure_ascii);
  if (sVar5 == 0) {
    peVar6 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    uVar7 = std::__cxx11::string::c_str();
    uVar8 = std::__cxx11::string::size();
    (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,uVar7,uVar8);
  }
  else {
    lVar9 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,lVar9 + sVar5,'\\',&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    i = 0;
    for (bytes = 0; uVar10 = std::__cxx11::string::size(), sVar5 = i, bytes < uVar10;
        bytes = bytes + 1) {
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
      cVar1 = *pcVar11;
      if (cVar1 == '\b') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x62;
        i = i + 2;
      }
      else if (cVar1 == '\t') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x74;
        i = i + 2;
      }
      else if (cVar1 == '\n') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x6e;
        i = i + 2;
      }
      else if (cVar1 == '\f') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x66;
        i = i + 2;
      }
      else if (cVar1 == '\r') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x72;
        i = i + 2;
      }
      else if (cVar1 == '\"') {
        puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
        *puVar14 = 0x22;
        i = i + 2;
      }
      else if (cVar1 == '\\') {
        i = i + 2;
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
        if (((-1 < *pcVar11) &&
            (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar11 < ' ')) ||
           ((ensure_ascii &&
            ((pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s),
             ((int)*pcVar11 & 0x80U) != 0 ||
             (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar11 == '\x7f'))))))
        {
          puVar12 = (uint8_t *)std::__cxx11::string::operator[]((ulong)s);
          sVar5 = bytes_following(*puVar12);
          if (sVar5 == 0xffffffffffffffff) {
            __assert_fail("bytes != std::string::npos",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                          ,0x19a1,
                          "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          uVar10 = std::__cxx11::string::size();
          if (uVar10 <= bytes + sVar5) {
            __assert_fail("i + bytes < s.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                          ,0x19a4,
                          "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          local_7c = 0;
          if (3 < sVar5) {
            __assert_fail("bytes <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                          ,0x19ab,
                          "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          switch(sVar5) {
          case 0:
            pbVar13 = (byte *)std::__cxx11::string::operator[]((ulong)s);
            local_7c = (uint)*pbVar13;
            break;
          case 1:
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar1 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            local_7c = ((int)cVar1 & 0x3fU) * 0x40 + ((int)*pcVar11 & 0x7fU);
            break;
          case 2:
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar1 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar2 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            local_7c = ((int)cVar1 & 0x1fU) * 0x1000 + ((int)cVar2 & 0x7fU) * 0x40 +
                       ((int)*pcVar11 & 0x7fU);
            break;
          case 3:
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar1 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar2 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            cVar3 = *pcVar11;
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)s);
            local_7c = ((int)cVar1 & 0xfU) * 0x40000 + ((int)cVar2 & 0x7fU) * 0x1000 +
                       ((int)cVar3 & 0x7fU) * 0x40 + ((int)*pcVar11 & 0x7fU);
          }
          escape_codepoint(local_7c,(string_t *)local_48,&i);
          bytes = sVar5 + bytes;
        }
        else {
          puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
          uVar4 = *puVar14;
          i = i + 1;
          puVar14 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
          *puVar14 = uVar4;
        }
      }
    }
    sVar15 = std::__cxx11::string::size();
    if (sVar5 != sVar15) {
      __assert_fail("pos == result.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                    ,0x19dd,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    peVar6 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    uVar7 = std::__cxx11::string::c_str();
    uVar8 = std::__cxx11::string::size();
    (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,uVar7,uVar8);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii) const
    {
        throw_if_invalid_utf8(s);

        const auto space = extra_space(s, ensure_ascii);
        if (space == 0)
        {
            o->write_characters(s.c_str(), s.size());
            return;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                case '"': // quotation mark (0x22)
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                case '\\': // reverse solidus (0x5C)
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                case '\b': // backspace (0x08)
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                case '\f': // formfeed (0x0C)
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                case '\n': // newline (0x0A)
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                case '\r': // carriage return (0x0D)
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                case '\t': // horizontal tab (0x09)
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    // escape control characters (0x00..0x1F) or, if
                    // ensure_ascii parameter is used, non-ASCII characters
                    if ((0x00 <= s[i] and s[i] <= 0x1F) or
                            (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F)))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        // check that the additional bytes are present
                        assert(i + bytes < s.size());

                        // to use \uxxxx escaping, we first need to calculate
                        // the codepoint from the UTF-8 bytes
                        int codepoint = 0;

                        // bytes is unsigned type:
                        assert(bytes <= 3);
                        switch (bytes)
                        {
                            case 0:
                            {
                                codepoint = s[i] & 0xFF;
                                break;
                            }

                            case 1:
                            {
                                codepoint = ((s[i] & 0x3F) << 6)
                                            + (s[i + 1] & 0x7F);
                                break;
                            }

                            case 2:
                            {
                                codepoint = ((s[i] & 0x1F) << 12)
                                            + ((s[i + 1] & 0x7F) << 6)
                                            + (s[i + 2] & 0x7F);
                                break;
                            }

                            case 3:
                            {
                                codepoint = ((s[i] & 0xF) << 18)
                                            + ((s[i + 1] & 0x7F) << 12)
                                            + ((s[i + 2] & 0x7F) << 6)
                                            + (s[i + 3] & 0x7F);
                                break;
                            }

                            default:
                                break;  // LCOV_EXCL_LINE
                        }

                        escape_codepoint(codepoint, result, pos);
                        i += bytes;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = s[i];
                    }
                    break;
                }
            }
        }

        assert(pos == result.size());
        o->write_characters(result.c_str(), result.size());
    }